

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O1

void soplex::
     SPxQuicksort<soplex::SPxBoundFlippingRT<double>::Breakpoint,soplex::SPxBoundFlippingRT<double>::BreakpointCompare>
               (Breakpoint *keys,int end,BreakpointCompare *compare,int start,bool type)

{
  Breakpoint *pBVar1;
  Breakpoint *pBVar2;
  double dVar3;
  double dVar4;
  bool bVar5;
  BreakpointSource BVar6;
  int iVar7;
  BreakpointSource BVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  Breakpoint *pBVar14;
  long lVar15;
  long lVar16;
  uint uVar17;
  uint uVar18;
  Breakpoint tmp;
  
  if (start + 1 < end) {
    uVar12 = end - 1;
    uVar9 = uVar12 - start;
    if (0x18 < (int)uVar9) {
LAB_0023ce61:
      iVar10 = (uVar9 >> 1) + start;
      pBVar1 = keys + iVar10;
      dVar3 = keys[iVar10].val;
      lVar13 = (long)start;
      lVar15 = -(long)(int)uVar12;
      uVar9 = uVar12;
      uVar17 = start;
      do {
        uVar11 = (ulong)uVar9;
        uVar18 = uVar17;
        if ((type & 1U) == 0) {
          if ((int)uVar17 < (int)uVar12) {
            pBVar14 = keys + (int)uVar17;
            lVar16 = 0;
            do {
              dVar4 = pBVar14->val;
              if (((dVar4 != dVar3) || (NAN(dVar4) || NAN(dVar3))) && (0.0 < dVar4 - dVar3)) {
                uVar18 = uVar17 - (int)lVar16;
                break;
              }
              lVar16 = lVar16 + -1;
              pBVar14 = pBVar14 + 1;
              uVar18 = uVar12;
            } while (lVar15 + (int)uVar17 != lVar16);
          }
          if (start < (int)uVar9) {
            uVar11 = (ulong)(int)uVar9;
            pBVar14 = keys + uVar11;
            do {
              if (pBVar14->val <= dVar3) goto LAB_0023cf5f;
              uVar11 = uVar11 - 1;
              pBVar14 = pBVar14 + -1;
            } while (lVar13 < (long)uVar11);
            goto LAB_0023cf5d;
          }
        }
        else {
          if ((int)uVar17 < (int)uVar12) {
            pBVar14 = keys + (int)uVar17;
            lVar16 = 0;
            do {
              if (dVar3 < pBVar14->val || dVar3 == pBVar14->val) {
                uVar18 = uVar17 - (int)lVar16;
                break;
              }
              lVar16 = lVar16 + -1;
              pBVar14 = pBVar14 + 1;
              uVar18 = uVar12;
            } while (lVar15 + (int)uVar17 != lVar16);
          }
          if (start < (int)uVar9) {
            uVar11 = (ulong)(int)uVar9;
            pBVar14 = keys + uVar11;
            do {
              dVar4 = pBVar14->val;
              if (((dVar4 != dVar3) || (NAN(dVar4) || NAN(dVar3))) && (dVar4 - dVar3 < 0.0))
              goto LAB_0023cf5f;
              uVar11 = uVar11 - 1;
              pBVar14 = pBVar14 + -1;
            } while (lVar13 < (long)uVar11);
LAB_0023cf5d:
            uVar11 = (ulong)(uint)start;
          }
        }
LAB_0023cf5f:
        uVar9 = (uint)uVar11;
        if ((int)uVar9 <= (int)uVar18) goto LAB_0023cf9a;
        pBVar14 = keys + (int)uVar18;
        dVar4 = pBVar14->val;
        iVar7 = pBVar14->idx;
        BVar8 = pBVar14->src;
        pBVar14 = keys + (int)uVar9;
        iVar10 = pBVar14->idx;
        BVar6 = pBVar14->src;
        pBVar2 = keys + (int)uVar18;
        pBVar2->val = pBVar14->val;
        pBVar2->idx = iVar10;
        pBVar2->src = BVar6;
        pBVar14 = keys + (int)uVar9;
        pBVar14->val = dVar4;
        pBVar14->idx = iVar7;
        pBVar14->src = BVar8;
        uVar17 = uVar18 + 1;
        uVar9 = uVar9 - 1;
      } while( true );
    }
LAB_0023d0d5:
    if (0 < (int)uVar9) {
      SPxShellsort<soplex::SPxBoundFlippingRT<double>::Breakpoint,soplex::SPxBoundFlippingRT<double>::BreakpointCompare>
                (keys,uVar12,compare,start);
      return;
    }
  }
  return;
LAB_0023cf9a:
  if ((type & 1U) == 0) {
    if (start < (int)uVar9) {
      uVar11 = (ulong)(int)uVar9;
      pBVar14 = keys + uVar11;
      do {
        dVar4 = pBVar14->val;
        if (((dVar3 != dVar4) || (NAN(dVar3) || NAN(dVar4))) && (0.0 < dVar3 - dVar4))
        goto LAB_0023d020;
        uVar11 = uVar11 - 1;
        pBVar14 = pBVar14 + -1;
      } while (lVar13 < (long)uVar11);
      uVar11 = (ulong)(uint)start;
    }
LAB_0023d020:
    uVar9 = (uint)uVar11;
    if (uVar9 == uVar12) {
      pBVar14 = keys + (int)uVar9;
      dVar3 = pBVar14->val;
      iVar7 = pBVar14->idx;
      BVar8 = pBVar14->src;
      iVar10 = pBVar1->idx;
      BVar6 = pBVar1->src;
      pBVar14 = keys + (int)uVar9;
      pBVar14->val = pBVar1->val;
      pBVar14->idx = iVar10;
      pBVar14->src = BVar6;
      pBVar1->val = dVar3;
      pBVar1->idx = iVar7;
      pBVar1->src = BVar8;
      uVar9 = uVar9 - 1;
    }
  }
  else {
    uVar17 = uVar18;
    if ((int)uVar18 < (int)uVar12) {
      pBVar14 = keys + (int)uVar18;
      lVar13 = 0;
      do {
        dVar4 = pBVar14->val;
        if (((dVar3 != dVar4) || (NAN(dVar3) || NAN(dVar4))) && (dVar3 - dVar4 < 0.0)) {
          uVar17 = uVar18 - (int)lVar13;
          break;
        }
        lVar13 = lVar13 + -1;
        pBVar14 = pBVar14 + 1;
        uVar17 = uVar12;
      } while ((long)(int)uVar18 - (long)(int)uVar12 != lVar13);
    }
    uVar18 = uVar17;
    if (uVar18 == start) {
      pBVar14 = keys + (int)uVar18;
      dVar3 = pBVar14->val;
      iVar7 = pBVar14->idx;
      BVar8 = pBVar14->src;
      iVar10 = pBVar1->idx;
      BVar6 = pBVar1->src;
      pBVar14 = keys + (int)uVar18;
      pBVar14->val = pBVar1->val;
      pBVar14->idx = iVar10;
      pBVar14->src = BVar6;
      pBVar1->val = dVar3;
      pBVar1->idx = iVar7;
      pBVar1->src = BVar8;
      uVar18 = uVar18 + 1;
    }
  }
  if ((int)(uVar12 - uVar18) < (int)(uVar9 - start)) {
    bVar5 = (int)uVar12 <= (int)uVar18;
    uVar17 = uVar9;
    uVar9 = uVar12;
    uVar12 = uVar18;
    uVar18 = start;
    if (bVar5) goto LAB_0023d0bb;
  }
  else {
    bVar5 = (int)uVar9 <= start;
    uVar17 = uVar12;
    uVar12 = start;
    start = uVar18;
    if (bVar5) goto LAB_0023d0bb;
  }
  SPxQuicksort<soplex::SPxBoundFlippingRT<double>::Breakpoint,soplex::SPxBoundFlippingRT<double>::BreakpointCompare>
            (keys,uVar9 + 1,compare,uVar12,(bool)(~type & 1));
  start = uVar18;
LAB_0023d0bb:
  uVar12 = uVar17;
  type = (bool)(type ^ 1);
  uVar9 = uVar12 - start;
  if ((int)uVar9 < 0x19) goto LAB_0023d0d5;
  goto LAB_0023ce61;
}

Assistant:

void SPxQuicksort(T* keys, int end, COMPARATOR& compare, int start = 0, bool type = true)
{
   assert(start >= 0);

   /* nothing to sort for less than two elements */
   if(end <= start + 1)
      return;

   /* reduce end position to last element index */
   --end;

   /* use quick-sort for long lists */
   while(end - start >= SOPLEX_SHELLSORTMAX)
   {
      T pivotkey;
      T tmp;
      int lo;
      int hi;
      int mid;

      /* select pivot element */
      mid = start + (end - start) / 2; // Instead of (start + end)/2 because the
      // latter can overflow if start + end >
      // INT_MAX
      pivotkey = keys[mid];

      /* partition the array into elements < pivot [start,hi] and elements >= pivot [lo,end] */
      lo = start;
      hi = end;

      for(;;)
      {
         if(type)
         {
            while(lo < end && compare(keys[lo], pivotkey) < 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) >= 0)
               hi--;
         }
         else
         {
            while(lo < end && compare(keys[lo], pivotkey) <= 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) > 0)
               hi--;
         }

         if(lo >= hi)
            break;

         tmp = keys[lo];
         keys[lo] = keys[hi];
         keys[hi] = tmp;

         lo++;
         hi--;
      }

      assert((hi == lo - 1) || (type && hi == start) || (!type && lo == end));

      /* skip entries which are equal to the pivot element (three partitions, <, =, > than pivot)*/
      if(type)
      {
         while(lo < end && compare(pivotkey, keys[lo]) >= 0)
            lo++;

         /* make sure that we have at least one element in the smaller partition */
         if(lo == start)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[lo];
            keys[lo] = keys[mid];
            keys[mid] = tmp;

            lo++;
         }
      }
      else
      {
         while(hi > start && compare(pivotkey, keys[hi]) <= 0)
            hi--;

         /* make sure that we have at least one element in the smaller partition */
         if(hi == end)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[hi];
            keys[hi] = keys[mid];
            keys[mid] = tmp;

            hi--;
         }
      }

      /* sort the smaller partition by a recursive call, sort the larger part without recursion */
      if(hi - start <= end - lo)
      {
         /* sort [start,hi] with a recursive call */
         if(start < hi)
         {
            SPxQuicksort(keys, hi + 1, compare, start, !type);
         }

         /* now focus on the larger part [lo,end] */
         start = lo;
      }
      else
      {
         if(lo < end)
         {
            SPxQuicksort(keys, end + 1, compare, lo, !type);
         }

         /* now focus on the larger part [start,hi] */
         end = hi;
      }

      type = !type;
   }

   /* use shell sort on the remaining small list */
   if(end - start >= 1)
   {
      SPxShellsort(keys, end, compare, start);
   }


#ifdef CHECK_SORTING

   for(int i = start; i < end; ++i)
      assert(compare(keys[i], keys[i + 1]) <= 0);

#endif
}